

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_6db88::ParserImpl::ParseExp
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *left,TokenDetail op,
          int left_priority)

{
  uint uVar1;
  int iVar2;
  String *pSVar3;
  GCObject *pGVar4;
  SyntaxTree *pSVar5;
  SyntaxTree *pSVar6;
  undefined8 uVar7;
  _Manager_type p_Var8;
  TokenDetail op_00;
  Lexer *pLVar9;
  TokenDetail *pTVar10;
  Lexer *pLVar11;
  ParseException *pPVar12;
  int in_ECX;
  undefined4 in_register_00000014;
  String *pSVar13;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar14;
  int iVar15;
  Lexer *local_90;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_88;
  String *local_80;
  Lexer *local_78;
  long *local_70;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_68;
  String *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pSVar13 = (String *)CONCAT44(in_register_00000014,left_priority);
  local_88.str_ = (String *)(left + 5);
  if (*(int *)&left[8]._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
    luna::Lexer::GetToken
              ((Lexer *)(left->_M_t).
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
               (TokenDetail *)local_88.str_);
  }
  iVar2 = *(int *)&left[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  local_68 = (anon_union_8_2_010d16d7_for_TokenDetail_0)this;
  local_60 = pSVar13;
  if (((iVar2 == 0x23) || (iVar2 == 0x10d)) || (iVar2 == 0x2d)) {
    NextToken((ParserImpl *)left);
    pLVar9 = (Lexer *)operator_new(0x30);
    pLVar9->state_ = (State *)&PTR__UnaryExpression_00154318;
    pLVar9->module_ = (String *)0x0;
    *(undefined8 *)&(pLVar9->in_stream_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pLVar9->in_stream_).super__Function_base._M_functor + 8) = 0;
    (pLVar9->in_stream_).super__Function_base._M_manager = (_Manager_type)0x0;
    *(undefined4 *)&(pLVar9->in_stream_)._M_invoker = 0x11e;
    pSVar5 = left[1]._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    pSVar6 = left[2]._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    uVar7 = *(undefined8 *)
             ((long)&left[3]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
    *(undefined8 *)((long)&(pLVar9->in_stream_).super__Function_base._M_functor + 0xc) =
         *(undefined8 *)
          ((long)&left[2]._M_t.
                  super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                  .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
    *(undefined8 *)((long)&(pLVar9->in_stream_).super__Function_base._M_manager + 4) = uVar7;
    *(SyntaxTree **)&(pLVar9->in_stream_).super__Function_base._M_functor = pSVar5;
    *(SyntaxTree **)((long)&(pLVar9->in_stream_).super__Function_base._M_functor + 8) = pSVar6;
    local_70 = (long *)0x0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    uStack_50._0_4_ = 0;
    uStack_50._4_4_ = 0;
    local_48.number_ = 0.0;
    uStack_40 = 0x11e;
    op_00._28_4_ = uStack_3c;
    op_00.token_ = 0x11e;
    op_00.line_ = 0;
    op_00.column_ = 0;
    op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op_00.module_ = (String *)0x0;
    ParseExp((ParserImpl *)&local_90,left,op_00,(int)&local_70);
    pLVar11 = local_90;
    local_90 = (Lexer *)0x0;
    pSVar13 = pLVar9->module_;
    pLVar9->module_ = (String *)pLVar11;
    if (pSVar13 != (String *)0x0) {
      (*(pSVar13->super_GCObject)._vptr_GCObject[1])();
    }
    local_90 = (Lexer *)0x0;
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
    local_70 = (long *)0x0;
    goto LAB_0012da2d;
  }
  iVar15 = *(int *)&left[8]._M_t.
                    super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                    .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (((0x17 < iVar15 - 0x106U) || ((0x839045U >> (iVar15 - 0x106U & 0x1f) & 1) == 0)) &&
     ((iVar15 != 0x28 && (iVar15 != 0x7b)))) {
    pPVar12 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar12,"unexpect token for exp.",(TokenDetail *)local_88.str_);
    __cxa_throw(pPVar12,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  if (iVar2 == 0x11e) {
    luna::Lexer::GetToken
              ((Lexer *)(left->_M_t).
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
               (TokenDetail *)local_88.str_);
  }
  iVar2 = *(int *)&left[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  uVar1 = iVar2 - 0x106;
  if (uVar1 < 0x18) {
    if ((0x831041U >> (uVar1 & 0x1f) & 1) != 0) {
      pLVar9 = (Lexer *)operator_new(0x30);
      pTVar10 = NextToken((ParserImpl *)left);
      pLVar9->state_ = (State *)&PTR__SyntaxTree_00154298;
      pSVar13 = pTVar10->module_;
      uVar7 = *(undefined8 *)&pTVar10->line_;
      p_Var8 = *(_Manager_type *)&pTVar10->token_;
      pLVar9->module_ = (String *)pTVar10->field_0;
      *(String **)&(pLVar9->in_stream_).super__Function_base._M_functor = pSVar13;
      *(undefined8 *)((long)&(pLVar9->in_stream_).super__Function_base._M_functor + 8) = uVar7;
      (pLVar9->in_stream_).super__Function_base._M_manager = p_Var8;
      (pLVar9->in_stream_)._M_invoker = (_Invoker_type)0x0;
      goto LAB_0012da2d;
    }
    if (uVar1 == 2) {
      NextToken((ParserImpl *)left);
      if (*(int *)&left[4]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x108) {
        __assert_fail("current_.token_ == Token_Function",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x7e,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseFunctionDef()"
                     );
      }
      ParseFunctionBody((ParserImpl *)&local_90);
      pLVar9 = local_90;
      goto LAB_0012da2d;
    }
    if (uVar1 != 0xf) goto LAB_0012dd89;
  }
  else {
LAB_0012dd89:
    if (iVar2 != 0x28) {
      if (iVar2 != 0x7b) {
        pPVar12 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (pPVar12,"unexpect token for exp.",(TokenDetail *)local_88.str_);
        __cxa_throw(pPVar12,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      ParseTableConstructor((ParserImpl *)&local_90);
      pLVar9 = local_90;
      goto LAB_0012da2d;
    }
  }
  ParsePrefixExp((ParserImpl *)&local_90,(PrefixExpType *)left);
  pLVar9 = local_90;
LAB_0012da2d:
  do {
    if (*(int *)&left[8]._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
      luna::Lexer::GetToken
                ((Lexer *)(left->_M_t).
                          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                          .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
                 (TokenDetail *)local_88.str_);
    }
    pSVar13 = local_60;
    aVar14 = local_68;
    iVar2 = *(int *)&left[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    if (iVar2 < 0x100) {
      if (iVar2 < 0x2f) {
        if (iVar2 < 0x2b) {
          if ((iVar2 == 0x25) || (iVar2 == 0x2a)) {
LAB_0012da9a:
            iVar15 = 0x50;
            goto LAB_0012daf6;
          }
        }
        else if ((iVar2 == 0x2b) || (iVar2 == 0x2d)) {
          iVar15 = 0x46;
          goto LAB_0012daf6;
        }
      }
      else if (iVar2 < 0x3e) {
        if (iVar2 == 0x2f) goto LAB_0012da9a;
        if (iVar2 == 0x3c) goto LAB_0012da81;
      }
      else {
        if (iVar2 == 0x3e) {
LAB_0012da81:
          iVar15 = 0x32;
          goto LAB_0012daf6;
        }
        iVar15 = 100;
        if (iVar2 == 0x5e) goto LAB_0012daf6;
      }
LAB_0012daeb:
      iVar15 = 0;
    }
    else if (iVar2 < 0x118) {
      if (iVar2 == 0x100) {
        iVar15 = 0x28;
      }
      else {
        if (iVar2 != 0x10e) goto LAB_0012daeb;
        iVar15 = 0x1e;
      }
    }
    else {
      if (iVar2 - 0x118U < 4) goto LAB_0012da81;
      if (iVar2 != 0x11c) goto LAB_0012daeb;
      iVar15 = 0x3c;
    }
LAB_0012daf6:
    if (iVar15 <= in_ECX) {
      if (iVar15 != in_ECX) {
        local_68 = aVar14;
        if ((local_60->super_GCObject)._vptr_GCObject != (_func_int **)0x0) {
          pLVar11 = (Lexer *)operator_new(0x38);
          pSVar3 = (String *)(pSVar13->super_GCObject)._vptr_GCObject;
          (pSVar13->super_GCObject)._vptr_GCObject = (_func_int **)0x0;
          pLVar11->state_ = (State *)&PTR__BinaryExpression_001542d8;
          pLVar11->module_ = pSVar3;
          *(Lexer **)&(pLVar11->in_stream_).super__Function_base._M_functor = pLVar9;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           ((long)&(pLVar11->in_stream_).super__Function_base._M_functor + 8) = op.field_0;
          (pLVar11->in_stream_).super__Function_base._M_manager = (_Manager_type)op.module_;
          (pLVar11->in_stream_)._M_invoker = (_Invoker_type)op._16_8_;
          pLVar11->current_ = op.token_;
          pLVar11->line_ = op._28_4_;
          local_68 = aVar14;
          pLVar9 = pLVar11;
        }
        goto LAB_0012dd1e;
      }
      if (*(int *)&left[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
        luna::Lexer::GetToken
                  ((Lexer *)(left->_M_t).
                            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                            .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
                   (TokenDetail *)local_88.str_);
      }
      pSVar13 = local_60;
      aVar14 = local_68;
      if (*(int *)&left[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x5e) {
        if (in_ECX == 0) {
LAB_0012dd1e:
          ((local_68.str_)->super_GCObject)._vptr_GCObject = (_func_int **)pLVar9;
          aVar14 = local_68;
        }
        else {
          if ((local_60->super_GCObject)._vptr_GCObject == (_func_int **)0x0) {
            __assert_fail("left",
                          "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                          ,0x49,
                          "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseExp(std::unique_ptr<SyntaxTree>, TokenDetail, int)"
                         );
          }
          local_80 = (String *)operator_new(0x38);
          pGVar4 = (GCObject *)(pSVar13->super_GCObject)._vptr_GCObject;
          (pSVar13->super_GCObject)._vptr_GCObject = (_func_int **)0x0;
          (local_80->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__BinaryExpression_001542d8;
          (local_80->super_GCObject).next_ = pGVar4;
          *(Lexer **)&(local_80->super_GCObject).field_0x10 = pLVar9;
          (local_80->field_1).str_ = (char *)op.field_0;
          *(String **)((long)&local_80->field_1 + 8) = op.module_;
          local_80->length_ = op.line_;
          *(int *)&local_80->field_0x2c = op.column_;
          local_80->hash_ = op._24_8_;
          pTVar10 = NextToken((ParserImpl *)left);
          ParseExp((ParserImpl *)aVar14.str_,left,*pTVar10,(int)&local_80);
          if (local_80 != (String *)0x0) {
            (*(local_80->super_GCObject)._vptr_GCObject[1])();
          }
        }
        return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)aVar14.number_;
      }
    }
    local_78 = pLVar9;
    pTVar10 = NextToken((ParserImpl *)left);
    ParseExp((ParserImpl *)&local_90,left,*pTVar10,(int)&local_78);
    pLVar9 = local_90;
    local_90 = (Lexer *)0x0;
    if (local_78 != (Lexer *)0x0) {
      (*(code *)(local_78->state_->string_pool_)._M_t.
                super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t
                .super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
                super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
    }
    local_78 = (Lexer *)0x0;
  } while( true );
}

Assistant:

std::unique_ptr<SyntaxTree> ParseExp(std::unique_ptr<SyntaxTree> left = std::unique_ptr<SyntaxTree>(),
                                             TokenDetail op = TokenDetail(),
                                             int left_priority = 0)
        {
            std::unique_ptr<SyntaxTree> exp;
            LookAhead();

            if (look_ahead_.token_ == '-' || look_ahead_.token_ == '#' || look_ahead_.token_ == Token_Not)
            {
                NextToken();
                std::unique_ptr<UnaryExpression> unexp(new UnaryExpression);
                unexp->op_token_ = current_;
                unexp->exp_ = ParseExp(std::unique_ptr<SyntaxTree>(), TokenDetail(), 90);
                exp = std::move(unexp);
            }
            else if (IsMainExp(look_ahead_))
                exp = ParseMainExp();
            else
                throw ParseException("unexpect token for exp.", look_ahead_);

            while (true)
            {
                int right_priority = GetOpPriority(LookAhead());
                if (left_priority < right_priority ||
                    (left_priority == right_priority && IsRightAssociation(LookAhead())))
                {
                    exp = ParseExp(std::move(exp), NextToken(), right_priority);
                }
                else if (left_priority == right_priority)
                {
                    if (left_priority == 0)
                        return exp;
                    assert(left);
                    exp = std::unique_ptr<BinaryExpression>(
                        new BinaryExpression(std::move(left), std::move(exp), op));
                    return ParseExp(std::move(exp), NextToken(), right_priority);
                }
                else
                {
                    if (left)
                        exp = std::unique_ptr<BinaryExpression>(
                            new BinaryExpression(std::move(left), std::move(exp), op));
                    return exp;
                }
            }
        }